

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double erlang_sample(double a,double b,int c,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double x;
  double dVar4;
  double b2;
  
  if (0 < c) {
    do {
      iVar1 = (*seed % 0x1f31d) * 0x41a7;
      iVar3 = (*seed / 0x1f31d) * -0xb14;
      iVar2 = iVar1 + iVar3;
      iVar1 = iVar1 + iVar3 + 0x7fffffff;
      if (-1 < iVar2) {
        iVar1 = iVar2;
      }
      *seed = iVar1;
      dVar4 = exponential_cdf_inv((double)iVar1 * 4.656612875e-10,0.0,b);
      a = a + dVar4;
      c = c + -1;
    } while (c != 0);
  }
  return a;
}

Assistant:

double erlang_sample ( double a, double b, int c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    ERLANG_SAMPLE samples the Erlang PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, int C, the parameters of the PDF.
//    0.0 < B.
//    0 < C.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double ERLANG_SAMPLE, a sample of the PDF.
//
{
  double a2;
  double b2;
  int i;
  double x;
  double x2;

  a2 = 0.0;
  b2 = b;
  x = a;

  for ( i = 1; i <= c; i++ )
  {
    x2 = exponential_sample ( a2, b2, seed );
    x = x + x2;
  }

  return x;
}